

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

ExprBase * EvaluateVoid(ExpressionEvalContext *ctx,ExprBase *expression)

{
  Allocator *pAVar1;
  SynBase *pSVar2;
  TypeBase *pTVar3;
  int iVar4;
  undefined4 extraout_var;
  ExprBase *pEVar5;
  
  pAVar1 = ctx->ctx->allocator;
  iVar4 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x30);
  pEVar5 = (ExprBase *)CONCAT44(extraout_var,iVar4);
  pSVar2 = expression->source;
  pTVar3 = ctx->ctx->typeVoid;
  pEVar5->typeID = 2;
  pEVar5->source = pSVar2;
  pEVar5->type = pTVar3;
  pEVar5->next = (ExprBase *)0x0;
  pEVar5->listed = false;
  pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240668;
  pEVar5 = CheckType(expression,pEVar5);
  return pEVar5;
}

Assistant:

ExprBase* EvaluateVoid(ExpressionEvalContext &ctx, ExprBase *expression)
{
	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}